

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkCollectMfsGates
              (char *pFileName,Vec_Ptr_t *vNamesRefed,Vec_Ptr_t *vNamesDerefed,int *nGates)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Acb_ObjType_t AVar4;
  Acb_Ntk_t *pNtk;
  Vec_Int_t *vNamesInv_00;
  Vec_Int_t *vObjsRefed_00;
  Vec_Int_t *vObjsDerefed_00;
  Vec_Int_t *p;
  int Type;
  int nFan;
  int RetValue;
  int iObj;
  int i;
  Vec_Int_t *vNodes;
  Vec_Int_t *vObjsDerefed;
  Vec_Int_t *vObjsRefed;
  Vec_Int_t *vNamesInv;
  Acb_Ntk_t *pNtkF;
  int *nGates_local;
  Vec_Ptr_t *vNamesDerefed_local;
  Vec_Ptr_t *vNamesRefed_local;
  char *pFileName_local;
  
  pNtk = Acb_VerilogSimpleRead(pFileName,(char *)0x0);
  vNamesInv_00 = Vec_IntInvert(&pNtk->vObjName,0);
  vObjsRefed_00 = Acb_NamesToIds(pNtk,vNamesInv_00,vNamesRefed);
  vObjsDerefed_00 = Acb_NamesToIds(pNtk,vNamesInv_00,vNamesDerefed);
  p = Acb_NtkCollectMffc(pNtk,vObjsRefed_00,vObjsDerefed_00);
  iVar1 = Vec_IntSize(p);
  Vec_IntFree(vNamesInv_00);
  Vec_IntFree(vObjsRefed_00);
  Vec_IntFree(vObjsDerefed_00);
  for (RetValue = 0; RetValue < 5; RetValue = RetValue + 1) {
    nGates[RetValue] = 0;
  }
  RetValue = 0;
  do {
    iVar2 = Vec_IntSize(p);
    if (iVar2 <= RetValue) {
      Vec_IntFree(p);
      Acb_ManFree(pNtk->pDesign);
      return iVar1;
    }
    iVar2 = Vec_IntEntry(p,RetValue);
    iVar3 = Acb_ObjFaninNum(pNtk,iVar2);
    AVar4 = Acb_ObjType(pNtk,iVar2);
    if (AVar4 == ABC_OPER_CONST_F) {
      *nGates = *nGates + 1;
    }
    else if (AVar4 == ABC_OPER_CONST_T) {
      nGates[1] = nGates[1] + 1;
    }
    else if ((AVar4 == ABC_OPER_BIT_BUF) || (AVar4 == ABC_OPER_CO)) {
      nGates[2] = nGates[2] + 1;
    }
    else if (AVar4 == ABC_OPER_BIT_INV) {
      nGates[3] = nGates[3] + 1;
    }
    else {
      if (iVar3 < 2) {
        __assert_fail("nFan >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                      ,0x127,"int Acb_NtkCollectMfsGates(char *, Vec_Ptr_t *, Vec_Ptr_t *, int *)");
      }
      iVar2 = Acb_ObjFaninNum(pNtk,iVar2);
      nGates[4] = iVar2 + -1 + nGates[4];
    }
    RetValue = RetValue + 1;
  } while( true );
}

Assistant:

int Acb_NtkCollectMfsGates( char * pFileName, Vec_Ptr_t * vNamesRefed, Vec_Ptr_t * vNamesDerefed, int nGates[5] )
{
    Acb_Ntk_t * pNtkF        = Acb_VerilogSimpleRead( pFileName, NULL );
    Vec_Int_t * vNamesInv    = Vec_IntInvert( &pNtkF->vObjName, 0 ) ;
    Vec_Int_t * vObjsRefed   = Acb_NamesToIds( pNtkF, vNamesInv, vNamesRefed );
    Vec_Int_t * vObjsDerefed = Acb_NamesToIds( pNtkF, vNamesInv, vNamesDerefed );
    Vec_Int_t * vNodes       = Acb_NtkCollectMffc( pNtkF, vObjsRefed, vObjsDerefed );
    int i, iObj, RetValue    = Vec_IntSize(vNodes);
    Vec_IntFree( vNamesInv );
    Vec_IntFree( vObjsRefed );
    Vec_IntFree( vObjsDerefed );
    for ( i = 0; i < 5; i++ )
        nGates[i] = 0;
    Vec_IntForEachEntry( vNodes, iObj, i )
    {
        int nFan = Acb_ObjFaninNum(pNtkF, iObj);
        int Type = Acb_ObjType( pNtkF, iObj );
        if ( Type == ABC_OPER_CONST_F ) 
            nGates[0]++;
        else if ( Type == ABC_OPER_CONST_T ) 
            nGates[1]++;
        else if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_CO ) 
            nGates[2]++;
        else if ( Type == ABC_OPER_BIT_INV ) 
            nGates[3]++;
        else
        {
            assert( nFan >= 2 );
            nGates[4] += Acb_ObjFaninNum(pNtkF, iObj)-1;
        }
    }
    Vec_IntFree( vNodes );
    Acb_ManFree( pNtkF->pDesign );
    return RetValue;
}